

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

Bit16s envelope_calcsin0(Bit16u phase,Bit16u envelope)

{
  uint uVar1;
  ushort uVar2;
  undefined6 in_register_00000032;
  
  uVar1 = phase & 0xff ^ 0xff;
  if ((phase >> 8 & 1) == 0) {
    uVar1 = phase & 0xff;
  }
  uVar2 = envelope_calcexp((uint)logsinrom[uVar1] + (int)CONCAT62(in_register_00000032,envelope) * 8
                          );
  return uVar2 ^ ((phase & 0x3ff) < 0x200) - 1;
}

Assistant:

Bit16s envelope_calcsin0(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	Bit16u neg = 0;
	if (phase & 0x200) {
		neg = ~0;
	}
	if (phase & 0x100) {
		out = logsinrom[(phase & 0xff) ^ 0xff];
	}
	else {
		out = logsinrom[phase & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3)) ^ neg;
}